

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# I64ToI32Lowering.cpp
# Opt level: O0

void __thiscall wasm::I64ToI32Lowering::visitAtomicRMW(I64ToI32Lowering *this,AtomicRMW *curr)

{
  IString str;
  initializer_list<wasm::Expression_*> __l;
  IString str_00;
  bool bVar1;
  Index IVar2;
  pointer pBVar3;
  pointer pBVar4;
  address64_t aVar5;
  Call *pCVar6;
  LocalSet *local_1e0;
  LocalGet *local_1d8;
  LocalGet *local_1d0;
  initializer_list<wasm::Expression_*> local_1c8;
  Block *local_1b8;
  Block *result;
  LocalGet *local_1a8;
  LocalGet *finalGet;
  LocalSet *setHigh;
  LocalSet *setLow;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_188;
  size_t local_168;
  char *pcStack_160;
  string_view local_150;
  Call *local_140;
  Call *getHigh;
  allocator<wasm::Expression_*> local_129;
  Type local_128;
  TempVar local_120;
  Const *local_100;
  Const *local_f8;
  Const *local_f0;
  Expression *local_e8;
  Expression *local_e0;
  LocalGet *local_d8;
  Const **local_d0;
  size_type local_c8;
  vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> local_c0;
  size_t local_a8;
  char *pcStack_a0;
  string_view local_98;
  Call *local_88;
  Call *getLow;
  Type local_70;
  undefined1 local_68 [8];
  TempVar highBits;
  undefined1 local_40 [8];
  TempVar lowBits;
  AtomicRMW *curr_local;
  I64ToI32Lowering *this_local;
  
  bVar1 = handleUnreachable(this,(Expression *)curr);
  if (!bVar1) {
    lowBits.ty.id._4_4_ = 3;
    bVar1 = wasm::Type::operator!=
                      (&(curr->super_SpecificExpression<(wasm::Expression::Id)24>).super_Expression.
                        type,(BasicType *)((long)&lowBits.ty.id + 4));
    if (!bVar1) {
      wasm::Type::Type(&highBits.ty,i32);
      getTemp((TempVar *)local_40,this,highBits.ty);
      wasm::Type::Type(&local_70,i32);
      getTemp((TempVar *)local_68,this,local_70);
      pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      local_a8 = ABI::wasm2js::ATOMIC_RMW_I64;
      pcStack_a0 = DAT_027e6238;
      str_00.str._M_str = DAT_027e6238;
      str_00.str._M_len = ABI::wasm2js::ATOMIC_RMW_I64;
      wasm::Name::Name((Name *)&local_98,str_00);
      pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      local_100 = Builder::makeConst<int>(pBVar4,curr->op);
      pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      local_f8 = Builder::makeConst<int>(pBVar4,(uint)curr->bytes);
      pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      aVar5 = wasm::Address::operator_cast_to_unsigned_long(&curr->offset);
      local_f0 = Builder::makeConst<int>(pBVar4,(int)aVar5);
      local_e8 = curr->ptr;
      local_e0 = curr->value;
      pBVar4 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      fetchOutParam(&local_120,this,curr->value);
      IVar2 = TempVar::operator_cast_to_unsigned_int(&local_120);
      wasm::Type::Type(&local_128,i32);
      local_d8 = Builder::makeLocalGet(pBVar4,IVar2,local_128);
      local_d0 = &local_100;
      local_c8 = 6;
      std::allocator<wasm::Expression_*>::allocator(&local_129);
      __l._M_len = local_c8;
      __l._M_array = (iterator)local_d0;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector
                (&local_c0,__l,&local_129);
      wasm::Type::Type((Type *)&getHigh,i32);
      pCVar6 = Builder::makeCall(pBVar3,(Name)local_98,&local_c0,(Type)getHigh,false);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_c0);
      std::allocator<wasm::Expression_*>::~allocator(&local_129);
      TempVar::~TempVar(&local_120);
      local_88 = pCVar6;
      pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      local_168 = ABI::wasm2js::GET_STASHED_BITS;
      pcStack_160 = DAT_027e6248;
      str.str._M_str = DAT_027e6248;
      str.str._M_len = ABI::wasm2js::GET_STASHED_BITS;
      wasm::Name::Name((Name *)&local_150,str);
      local_188.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_188.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_188.super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::vector(&local_188);
      wasm::Type::Type((Type *)&setLow,i32);
      pCVar6 = Builder::makeCall(pBVar3,(Name)local_150,&local_188,(Type)setLow,false);
      std::vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>::~vector(&local_188);
      local_140 = pCVar6;
      pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_40);
      setHigh = Builder::makeLocalSet(pBVar3,IVar2,(Expression *)local_88);
      pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_68);
      finalGet = (LocalGet *)Builder::makeLocalSet(pBVar3,IVar2,(Expression *)local_140);
      pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      IVar2 = TempVar::operator_cast_to_unsigned_int((TempVar *)local_40);
      wasm::Type::Type((Type *)&result,i32);
      local_1a8 = Builder::makeLocalGet(pBVar3,IVar2,(Type)result);
      pBVar3 = std::unique_ptr<wasm::Builder,_std::default_delete<wasm::Builder>_>::operator->
                         (&this->builder);
      local_1e0 = setHigh;
      local_1d8 = finalGet;
      local_1d0 = local_1a8;
      local_1c8._M_array = (iterator)&local_1e0;
      local_1c8._M_len = 3;
      local_1b8 = Builder::makeBlock(pBVar3,&local_1c8);
      setOutParam(this,(Expression *)local_1b8,(TempVar *)local_68);
      Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>::replaceCurrent
                (&(this->
                  super_WalkerPass<wasm::PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>_>
                  ).
                  super_PostWalker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                  .
                  super_Walker<wasm::I64ToI32Lowering,_wasm::Visitor<wasm::I64ToI32Lowering,_void>_>
                 ,(Expression *)local_1b8);
      TempVar::~TempVar((TempVar *)local_68);
      TempVar::~TempVar((TempVar *)local_40);
    }
  }
  return;
}

Assistant:

void visitAtomicRMW(AtomicRMW* curr) {
    if (handleUnreachable(curr)) {
      return;
    }
    if (curr->type != Type::i64) {
      return;
    }
    // We cannot break this up into smaller operations as it must be atomic.
    // Lower to an instrinsic function that wasm2js will implement.
    TempVar lowBits = getTemp();
    TempVar highBits = getTemp();
    auto* getLow = builder->makeCall(
      ABI::wasm2js::ATOMIC_RMW_I64,
      {builder->makeConst(int32_t(curr->op)),
       builder->makeConst(int32_t(curr->bytes)),
       builder->makeConst(int32_t(curr->offset)),
       curr->ptr,
       curr->value,
       builder->makeLocalGet(fetchOutParam(curr->value), Type::i32)},
      Type::i32);
    auto* getHigh =
      builder->makeCall(ABI::wasm2js::GET_STASHED_BITS, {}, Type::i32);
    auto* setLow = builder->makeLocalSet(lowBits, getLow);
    auto* setHigh = builder->makeLocalSet(highBits, getHigh);
    auto* finalGet = builder->makeLocalGet(lowBits, Type::i32);
    auto* result = builder->makeBlock({setLow, setHigh, finalGet});
    setOutParam(result, std::move(highBits));
    replaceCurrent(result);
  }